

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmMakefile *this_00;
  pointer ppVar4;
  cmState *this_01;
  allocator local_105 [13];
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  cmListFileContext lfc;
  __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
  local_68;
  const_iterator it;
  undefined1 local_48 [8];
  cmOutputConverter converter;
  char *sigString;
  TLLSignature sig_local;
  ostream *s_local;
  cmTarget *this_local;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  converter._24_8_ = pcVar2;
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,(char *)converter._24_8_);
  std::operator<<(poVar3," signature are here:\n");
  this_00 = GetMakefile(this);
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&it,this_00);
  cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_48,(cmStateSnapshot *)&it);
  local_68._M_current =
       (pair<cmTarget::TLLSignature,_cmListFileContext> *)
       std::
       vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
       ::begin(&this->TLLCommands);
  while( true ) {
    lfc.Line = (long)std::
                     vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                     ::end(&this->TLLCommands);
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                        *)&lfc.Line);
    if (!bVar1) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
             ::operator->(&local_68);
    if (ppVar4->first == sig) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
               ::operator->(&local_68);
      cmListFileContext::cmListFileContext((cmListFileContext *)local_b8,&ppVar4->second);
      this_01 = cmMakefile::GetState(this->Makefile);
      pcVar2 = cmState::GetSourceDirectory(this_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,pcVar2,local_105);
      cmOutputConverter::ConvertToRelativePath
                (&local_d8,(cmOutputConverter *)local_48,&local_f8,
                 (string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)local_105);
      poVar3 = std::operator<<(s," * ");
      poVar3 = ::operator<<(poVar3,(cmListFileContext *)local_b8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_b8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for (Container::const_iterator it = this->TLLCommands.begin();
       it != this->TLLCommands.end(); ++it) {
    if (it->first == sig) {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}